

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O0

void __thiscall
Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>::PullLowpass
          (PullLowpass<GI::AY38910::AY38910<false>_> *this,AY38910<false> *sample_source)

{
  AY38910<false> *sample_source_local;
  PullLowpass<GI::AY38910::AY38910<false>_> *this_local;
  
  LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>::LowpassBase
            (&this->
              super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>)
  ;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>).
  super_Speaker._vptr_Speaker = (_func_int **)&PTR__PullLowpass_00c9dc20;
  this->sample_source_ = sample_source;
  GI::AY38910::AY38910SampleSource<false>::set_sample_volume_range
            (&sample_source->super_AY38910SampleSource<false>,0x7fff);
  return;
}

Assistant:

PullLowpass(SampleSource &sample_source) : sample_source_(sample_source) {
			// Propagate an initial volume level.
			sample_source.set_sample_volume_range(32767);
		}